

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O2

void __thiscall efsw::DirWatcherGeneric::~DirWatcherGeneric(DirWatcherGeneric *this)

{
  DirWatcherGeneric *this_00;
  bool bVar1;
  _Base_ptr p_Var2;
  _List_node_base *p_Var3;
  _Self __tmp;
  DirectorySnapshotDiff *pDVar4;
  allocator<char> local_139;
  string local_138;
  string local_118;
  DirectorySnapshotDiff Diff;
  
  if (this->Deleted == true) {
    DirectorySnapshot::scan(&Diff,&this->DirSnap);
    bVar1 = DirectorySnapshot::exists(&this->DirSnap);
    if (!bVar1) {
      pDVar4 = &Diff;
      while (pDVar4 = (DirectorySnapshotDiff *)
                      (pDVar4->FilesDeleted).
                      super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl.
                      _M_node.super__List_node_base._M_next, pDVar4 != &Diff) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_139);
        handleAction(this,(string *)
                          &(pDVar4->FilesDeleted).
                           super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl
                           ._M_node._M_size,2,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
      }
      p_Var3 = (_List_node_base *)&Diff.DirsDeleted;
      while (p_Var3 = (((_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)
                       &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var3 != (_List_node_base *)&Diff.DirsDeleted) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"",&local_139);
        handleAction(this,(string *)(p_Var3 + 1),2,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
      }
    }
    DirectorySnapshotDiff::~DirectorySnapshotDiff(&Diff);
  }
  p_Var2 = (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(this->Directories)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
      ::~_Rb_tree(&(this->Directories)._M_t);
      DirectorySnapshot::~DirectorySnapshot(&this->DirSnap);
      return;
    }
    this_00 = *(DirWatcherGeneric **)(p_Var2 + 2);
    if (this->Deleted == true) {
      this_00->Deleted = true;
LAB_0011b007:
      ~DirWatcherGeneric(this_00);
      operator_delete(this_00,0xc0);
      *(undefined8 *)(p_Var2 + 2) = 0;
    }
    else if (this_00 != (DirWatcherGeneric *)0x0) goto LAB_0011b007;
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

DirWatcherGeneric::~DirWatcherGeneric()
{
	/// If the directory was deleted mark the files as deleted
	if ( Deleted )
	{
		DirectorySnapshotDiff Diff = DirSnap.scan();

		if ( !DirSnap.exists() )
		{
			FileInfoList::iterator it;

			DiffIterator( FilesDeleted )
			{
				handleAction( (*it).Filepath, Actions::Delete );
			}

			DiffIterator( DirsDeleted )
			{
				handleAction( (*it).Filepath, Actions::Delete );
			}
		}
	}

	DirWatchMap::iterator it = Directories.begin();

	for ( ; it != Directories.end(); it++ )
	{
		if ( Deleted )
		{
			/// If the directory was deleted, mark the flag for file deletion
			it->second->Deleted = true;
		}

		efSAFE_DELETE( it->second );
	}
}